

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterCase::init
          (AtomicCounterCase *this,EVP_PKEY_CTX *ctx)

{
  ContextType type;
  GLSLVersion version;
  int extraout_EAX;
  Program *this_00;
  Shader *pSVar1;
  DefaultBlock *this_01;
  allocator<char> local_c9;
  VarType local_c8;
  string local_b0;
  Layout local_8c;
  VariableDeclaration decl;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  this_00 = (Program *)operator_new(0x48);
  ProgramInterfaceDefinition::Program::Program(this_00);
  this->m_program = this_00;
  pSVar1 = ProgramInterfaceDefinition::Program::addShader(this_00,SHADERTYPE_COMPUTE,version);
  glu::VarType::VarType(&local_c8,TYPE_UINT_ATOMIC_COUNTER,PRECISION_LAST);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"binding1_counter1",&local_c9);
  glu::Layout::Layout(&local_8c,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&decl,&local_c8,&local_b0,STORAGE_UNIFORM,INTERPOLATION_LAST,&local_8c,0);
  std::__cxx11::string::~string((string *)&local_b0);
  glu::VarType::~VarType(&local_c8);
  decl.layout.binding = 1;
  this_01 = &pSVar1->m_defaultBlock;
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
            (&this_01->variables,&decl);
  glu::VariableDeclaration::~VariableDeclaration(&decl);
  glu::VarType::VarType(&local_c8,TYPE_UINT_ATOMIC_COUNTER,PRECISION_LAST);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"binding1_counter2",&local_c9);
  glu::Layout::Layout(&local_8c,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&decl,&local_c8,&local_b0,STORAGE_UNIFORM,INTERPOLATION_LAST,&local_8c,0);
  std::__cxx11::string::~string((string *)&local_b0);
  glu::VarType::~VarType(&local_c8);
  decl.layout.binding = 1;
  decl.layout.offset = 8;
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
            (&this_01->variables,&decl);
  glu::VariableDeclaration::~VariableDeclaration(&decl);
  glu::VarType::VarType(&local_c8,TYPE_UINT_ATOMIC_COUNTER,PRECISION_LAST);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"binding2_counter1",&local_c9);
  glu::Layout::Layout(&local_8c,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  glu::VariableDeclaration::VariableDeclaration
            (&decl,&local_c8,&local_b0,STORAGE_UNIFORM,INTERPOLATION_LAST,&local_8c,0);
  std::__cxx11::string::~string((string *)&local_b0);
  glu::VarType::~VarType(&local_c8);
  decl.layout.binding = 2;
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
            (&this_01->variables,&decl);
  glu::VariableDeclaration::~VariableDeclaration(&decl);
  return extraout_EAX;
}

Assistant:

void AtomicCounterCase::init (void)
{
	ProgramInterfaceDefinition::Shader* shader;
	glu::GLSLVersion glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());

	m_program = new ProgramInterfaceDefinition::Program();
	shader = m_program->addShader(glu::SHADERTYPE_COMPUTE, glslVersion);

	{
		glu::VariableDeclaration decl(glu::VarType(glu::TYPE_UINT_ATOMIC_COUNTER, glu::PRECISION_LAST), "binding1_counter1", glu::STORAGE_UNIFORM);
		decl.layout.binding = 1;
		shader->getDefaultBlock().variables.push_back(decl);
	}
	{
		glu::VariableDeclaration decl(glu::VarType(glu::TYPE_UINT_ATOMIC_COUNTER, glu::PRECISION_LAST), "binding1_counter2", glu::STORAGE_UNIFORM);
		decl.layout.binding = 1;
		decl.layout.offset = 8;

		shader->getDefaultBlock().variables.push_back(decl);
	}
	{
		glu::VariableDeclaration decl(glu::VarType(glu::TYPE_UINT_ATOMIC_COUNTER, glu::PRECISION_LAST), "binding2_counter1", glu::STORAGE_UNIFORM);
		decl.layout.binding = 2;
		shader->getDefaultBlock().variables.push_back(decl);
	}

	DE_ASSERT(m_program->isValid());
}